

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O0

void restore_processing_stripe_boundary
               (RestorationTileLimits *limits,RestorationLineBuffers *rlbs,int use_highbd,int h,
               uint8_t *data8,int data_stride,int copy_above,int copy_below,int opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ECX;
  int in_EDX;
  void *in_RSI;
  int *in_RDI;
  long in_R8;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  uint8_t *dst8_3;
  uint8_t *data8_bl_1;
  int stripe_bottom_1;
  uint8_t *dst8_2;
  uint8_t *data8_tl_1;
  uint8_t *dst8_1;
  int i_1;
  uint8_t *data8_bl;
  int stripe_bottom;
  uint8_t *dst8;
  int i;
  uint8_t *data8_tl;
  int data_x0;
  int line_size;
  int line_width;
  void *local_b0;
  void *local_a8;
  void *local_a0;
  void *local_98;
  int local_5c;
  int local_3c;
  
  iVar2 = (in_RDI[1] - *in_RDI) + 8 << ((byte)in_EDX & 0x1f);
  iVar3 = *in_RDI + -4;
  if (in_stack_00000018 == 0) {
    if (in_stack_00000008 != 0) {
      iVar1 = in_RDI[2];
      for (local_3c = -3; local_3c < 0; local_3c = local_3c + 1) {
        local_98 = (void *)(in_R8 + iVar3 + (long)(iVar1 * in_R9D) + (long)(local_3c * in_R9D));
        if (in_EDX != 0) {
          local_98 = (void *)((long)local_98 * 2);
        }
        memcpy(local_98,(void *)((long)in_RSI + (long)(local_3c + 3) * 0x310),(long)iVar2);
      }
    }
    if (in_stack_00000010 != 0) {
      iVar1 = in_RDI[2];
      for (local_5c = 0; (local_5c < 3 && (iVar1 + in_ECX + local_5c < in_RDI[3] + 3));
          local_5c = local_5c + 1) {
        local_a0 = (void *)(in_R8 + iVar3 + (long)((iVar1 + in_ECX) * in_R9D) +
                           (long)(local_5c * in_R9D));
        if (in_EDX != 0) {
          local_a0 = (void *)((long)local_a0 * 2);
        }
        memcpy(local_a0,(void *)((long)in_RSI + (long)local_5c * 0x310 + 0x930),(long)iVar2);
      }
    }
  }
  else {
    if (in_stack_00000008 != 0) {
      local_a8 = (void *)(in_R8 + iVar3 + (long)(in_RDI[2] * in_R9D) + (long)(in_R9D * -3));
      if (in_EDX != 0) {
        local_a8 = (void *)((long)local_a8 * 2);
      }
      memcpy(local_a8,in_RSI,(long)iVar2);
    }
    if ((in_stack_00000010 != 0) && (in_RDI[2] + in_ECX + 2 < in_RDI[3] + 3)) {
      local_b0 = (void *)(in_R8 + iVar3 + (long)((in_RDI[2] + in_ECX) * in_R9D) +
                         (long)(in_R9D << 1));
      if (in_EDX != 0) {
        local_b0 = (void *)((long)local_b0 * 2);
      }
      memcpy(local_b0,(void *)((long)in_RSI + 0xf50),(long)iVar2);
    }
  }
  return;
}

Assistant:

static void restore_processing_stripe_boundary(
    const RestorationTileLimits *limits, const RestorationLineBuffers *rlbs,
    int use_highbd, int h, uint8_t *data8, int data_stride, int copy_above,
    int copy_below, int opt) {
  const int line_width =
      (limits->h_end - limits->h_start) + 2 * RESTORATION_EXTRA_HORZ;
  const int line_size = line_width << use_highbd;

  const int data_x0 = limits->h_start - RESTORATION_EXTRA_HORZ;

  if (!opt) {
    if (copy_above) {
      uint8_t *data8_tl = data8 + data_x0 + limits->v_start * data_stride;
      for (int i = -RESTORATION_BORDER; i < 0; ++i) {
        uint8_t *dst8 = data8_tl + i * data_stride;
        memcpy(REAL_PTR(use_highbd, dst8),
               rlbs->tmp_save_above[i + RESTORATION_BORDER], line_size);
      }
    }

    if (copy_below) {
      const int stripe_bottom = limits->v_start + h;
      uint8_t *data8_bl = data8 + data_x0 + stripe_bottom * data_stride;

      for (int i = 0; i < RESTORATION_BORDER; ++i) {
        if (stripe_bottom + i >= limits->v_end + RESTORATION_BORDER) break;

        uint8_t *dst8 = data8_bl + i * data_stride;
        memcpy(REAL_PTR(use_highbd, dst8), rlbs->tmp_save_below[i], line_size);
      }
    }
  } else {
    if (copy_above) {
      uint8_t *data8_tl = data8 + data_x0 + limits->v_start * data_stride;

      // Only restore i=-RESTORATION_BORDER line.
      uint8_t *dst8 = data8_tl + (-RESTORATION_BORDER) * data_stride;
      memcpy(REAL_PTR(use_highbd, dst8), rlbs->tmp_save_above[0], line_size);
    }

    if (copy_below) {
      const int stripe_bottom = limits->v_start + h;
      uint8_t *data8_bl = data8 + data_x0 + stripe_bottom * data_stride;

      // Only restore i=2 line.
      if (stripe_bottom + 2 < limits->v_end + RESTORATION_BORDER) {
        uint8_t *dst8 = data8_bl + 2 * data_stride;
        memcpy(REAL_PTR(use_highbd, dst8), rlbs->tmp_save_below[2], line_size);
      }
    }
  }
}